

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_relay.cpp
# Opt level: O3

void __thiscall UDPRelay::HandleEvent(UDPRelay *this,SOCKET s,int event)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  if (this->server_socket_ == s) {
    if ((event & 8U) != 0) {
      Log::GetInstance();
      Log::FormatTime_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_38,local_30);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [info] ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"UDP server_socket err",0x15);
      if (local_38 != local_28) {
        operator_delete(local_38);
      }
    }
    HandleServer(this);
  }
  else if ((s != -1) &&
          (p_Var2 = (this->sockets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
          p_Var2 != (_Base_ptr)0x0)) {
    p_Var1 = &(this->sockets_)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (s <= (int)p_Var2[1]._M_color) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < s];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color <= s)) {
      if ((event & 8U) != 0) {
        Log::GetInstance();
        Log::FormatTime_abi_cxx11_();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_38,local_30);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [info] ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"UDP client_socket err",0x15);
        if (local_38 != local_28) {
          operator_delete(local_38);
        }
      }
      HandleClient(this,s);
    }
  }
  return;
}

Assistant:

void UDPRelay::HandleEvent(SOCKET s, int event)
{
    if (s == server_socket_)
    {
        if (event & kPollErr)
        {
            LOGI << "UDP server_socket err";
        }
        HandleServer();
    }
    else if(s != INVALID_SOCKET &&
            sockets_.find(s) != sockets_.end())
    {
        if (event & kPollErr)
        {
            LOGI << "UDP client_socket err";
        }
        HandleClient(s);
    }
}